

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_store.cpp
# Opt level: O1

void __thiscall
Am_State_Store::Am_State_Store
          (Am_State_Store *this,Am_Object *in_self,Am_Object *in_owner,bool in_visible,int in_left,
          int in_top,int in_width,int in_height)

{
  (this->owner).data = (Am_Object_Data *)0x0;
  (this->self).data = (Am_Object_Data *)0x0;
  Am_Object::operator=(&this->self,in_self);
  Am_Object::operator=(&this->owner,in_owner);
  this->visible = in_visible;
  this->left = in_left;
  this->top = in_top;
  this->width = in_width;
  this->height = in_height;
  this->in_list = false;
  this->needs_update = false;
  return;
}

Assistant:

Am_State_Store::Am_State_Store(Am_Object in_self, Am_Object in_owner,
                               bool in_visible, int in_left, int in_top,
                               int in_width, int in_height)
{
  self = in_self;
  owner = in_owner;
  visible = in_visible;
  left = in_left;
  top = in_top;
  width = in_width;
  height = in_height;
  in_list = false;
  needs_update = false;
  //// DEBUG
  // std::cout << "New State " << *self << " <l" << left << ", t" << top << ", w"
  //     << width << ", h" << height << ">" <<std::endl;
}